

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O2

void Abc_SclReadSurface(Vec_Str_t *vOut,int *pPos,SC_Surface *p)

{
  int iVar1;
  Vec_Flt_t *p_00;
  Vec_Int_t *p_01;
  long lVar2;
  int iVar3;
  bool bVar4;
  float fVar5;
  
  iVar1 = Vec_StrGetI(vOut,pPos);
  while (bVar4 = iVar1 != 0, iVar1 = iVar1 + -1, bVar4) {
    fVar5 = Vec_StrGetF(vOut,pPos);
    Vec_FltPush(&p->vIndex0,fVar5);
    Vec_IntPush(&p->vIndex0I,(int)(fVar5 * 1000.0));
  }
  iVar1 = Vec_StrGetI(vOut,pPos);
  while (bVar4 = iVar1 != 0, iVar1 = iVar1 + -1, bVar4) {
    fVar5 = Vec_StrGetF(vOut,pPos);
    Vec_FltPush(&p->vIndex1,fVar5);
    Vec_IntPush(&p->vIndex1I,(int)(fVar5 * 1000.0));
  }
  for (iVar1 = 0; iVar1 < (p->vIndex0).nSize; iVar1 = iVar1 + 1) {
    p_00 = Vec_FltAlloc((p->vIndex1).nSize);
    Vec_PtrPush(&p->vData,p_00);
    p_01 = Vec_IntAlloc((p->vIndex1).nSize);
    Vec_PtrPush(&p->vDataI,p_01);
    for (iVar3 = 0; iVar3 < (p->vIndex1).nSize; iVar3 = iVar3 + 1) {
      fVar5 = Vec_StrGetF(vOut,pPos);
      Vec_FltPush(p_00,fVar5);
      Vec_IntPush(p_01,(int)(fVar5 * 1000.0));
    }
  }
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    fVar5 = Vec_StrGetF(vOut,pPos);
    p->approx[0][lVar2] = fVar5;
  }
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    fVar5 = Vec_StrGetF(vOut,pPos);
    p->approx[1][lVar2] = fVar5;
  }
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    fVar5 = Vec_StrGetF(vOut,pPos);
    p->approx[2][lVar2] = fVar5;
  }
  return;
}

Assistant:

static void Abc_SclReadSurface( Vec_Str_t * vOut, int * pPos, SC_Surface * p )
{
    Vec_Flt_t * vVec;
    Vec_Int_t * vVecI;
    int i, j;

    for ( i = Vec_StrGetI(vOut, pPos); i != 0; i-- )
    {
        float Num = Vec_StrGetF(vOut, pPos);
        Vec_FltPush( &p->vIndex0, Num );
        Vec_IntPush( &p->vIndex0I, Scl_Flt2Int(Num) );
    }

    for ( i = Vec_StrGetI(vOut, pPos); i != 0; i-- )
    {
        float Num = Vec_StrGetF(vOut, pPos);
        Vec_FltPush( &p->vIndex1, Num );
        Vec_IntPush( &p->vIndex1I, Scl_Flt2Int(Num) );
    }

    for ( i = 0; i < Vec_FltSize(&p->vIndex0); i++ )
    {
        vVec = Vec_FltAlloc( Vec_FltSize(&p->vIndex1) );
        Vec_PtrPush( &p->vData, vVec );
        vVecI = Vec_IntAlloc( Vec_FltSize(&p->vIndex1) );
        Vec_PtrPush( &p->vDataI, vVecI );
        for ( j = 0; j < Vec_FltSize(&p->vIndex1); j++ )
        {
            float Num = Vec_StrGetF(vOut, pPos);
            Vec_FltPush( vVec, Num );
            Vec_IntPush( vVecI, Scl_Flt2Int(Num) );
        }
    }

    for ( i = 0; i < 3; i++ ) 
        p->approx[0][i] = Vec_StrGetF( vOut, pPos );
    for ( i = 0; i < 4; i++ ) 
        p->approx[1][i] = Vec_StrGetF( vOut, pPos );
    for ( i = 0; i < 6; i++ ) 
        p->approx[2][i] = Vec_StrGetF( vOut, pPos );
}